

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O1

EVP_MD * EVP_get_digestbyobj(ASN1_OBJECT *obj)

{
  uint8_t *puVar1;
  EVP_MD *pEVar2;
  long lVar3;
  CBS cbs;
  CBS local_20;
  
  if (obj->nid == 0) {
    puVar1 = OBJ_get0_data(obj);
    local_20.len = OBJ_length(obj);
    local_20.data = puVar1;
    pEVar2 = cbs_to_md(&local_20);
  }
  else {
    lVar3 = 8;
    pEVar2 = (EVP_MD *)0x0;
    do {
      if (*(int *)((long)&PTR_anon_var_dwarf_241883_002d4eb8 + lVar3) == obj->nid) {
        pEVar2 = (EVP_MD *)(**(code **)((long)&nid_to_digest_mapping[0].nid + lVar3))();
        return pEVar2;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x248);
  }
  return pEVar2;
}

Assistant:

const EVP_MD *EVP_get_digestbyobj(const ASN1_OBJECT *obj) {
  // Handle objects with no corresponding OID. Note we don't use |OBJ_obj2nid|
  // here to avoid pulling in the OID table.
  if (obj->nid != NID_undef) {
    return EVP_get_digestbynid(obj->nid);
  }

  CBS cbs;
  CBS_init(&cbs, OBJ_get0_data(obj), OBJ_length(obj));
  return cbs_to_md(&cbs);
}